

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
::find_non_soo<int>(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *this,key_arg<int> *key,size_t hash)

{
  bool bVar1;
  h2_t hash_00;
  CommonFields *common;
  ctrl_t *pcVar2;
  size_t sVar3;
  slot_type *psVar4;
  pair<const_int,_double> *ts;
  char *pcVar5;
  char *pcVar6;
  int __c;
  NonIterableBitMask<unsigned_short,_16,_0> *b;
  iterator iVar7;
  unsigned_short local_92;
  EqualElement<int> local_90;
  uint32_t local_7c;
  NonIterableBitMask<unsigned_short,_16,_0> local_76;
  uint32_t i;
  BitMask<unsigned_short,_16,_0,_false> __end5;
  BitMask<unsigned_short,_16,_0,_false> __begin5;
  BitMask<unsigned_short,_16,_0,_false> *pBStack_70;
  BitMask<unsigned_short,_16,_0,_false> *__range5;
  Group g;
  ctrl_t *ctrl;
  probe_seq<16UL> seq;
  size_t hash_local;
  key_arg<int> *key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *this_local;
  
  seq.index_ = hash;
  bVar1 = is_soo(this);
  if (bVar1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe2a,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, double>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, double>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<int, double>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, double>>, K = int]"
                 );
  }
  common = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
           ::common(this);
  probe((probe_seq<16UL> *)&ctrl,common,seq.index_);
  pcVar2 = control(this);
  do {
    sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl);
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)&__range5,pcVar2 + sVar3);
    hash_00 = H2(seq.index_);
    i._2_2_ = (unsigned_short)GroupSse2Impl::Match((GroupSse2Impl *)&__range5,hash_00);
    pBStack_70 = (BitMask<unsigned_short,_16,_0,_false> *)((long)&i + 2);
    i._0_2_ = (unsigned_short)BitMask<unsigned_short,_16,_0,_false>::begin(pBStack_70);
    local_76.mask_ = (unsigned_short)BitMask<unsigned_short,_16,_0,_false>::end(pBStack_70);
    while( true ) {
      b = &local_76;
      bVar1 = container_internal::operator!=
                        ((BitMask<unsigned_short,_16,_0,_false> *)&i,
                         (BitMask<unsigned_short,_16,_0,_false> *)b);
      if (!bVar1) break;
      local_7c = BitMask<unsigned_short,_16,_0,_false>::operator*
                           ((BitMask<unsigned_short,_16,_0,_false> *)&i);
      local_90.rhs = key;
      local_90.eq = eq_ref(this);
      psVar4 = slot_array(this);
      sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl,(ulong)local_7c);
      ts = common_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,double>,void>
           ::element<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,double>>
                     (psVar4 + sVar3);
      bVar1 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,double>,void>
              ::
              apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,double>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,double>>>::EqualElement<int>,std::pair<int_const,double>&,absl::lts_20250127::container_internal::FlatHashMapPolicy<int,double>>
                        (&local_90,ts);
      if (bVar1) {
        sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)&ctrl,(ulong)local_7c);
        iVar7 = iterator_at(this,sVar3);
        return iVar7;
      }
      BitMask<unsigned_short,_16,_0,_false>::operator++((BitMask<unsigned_short,_16,_0,_false> *)&i)
      ;
    }
    local_92 = (unsigned_short)GroupSse2Impl::MaskEmpty((GroupSse2Impl *)&__range5);
    bVar1 = NonIterableBitMask::operator_cast_to_bool((NonIterableBitMask *)&local_92);
    if (bVar1) {
      iVar7 = end(this);
      return iVar7;
    }
    probe_seq<16UL>::next((probe_seq<16UL> *)&ctrl);
    pcVar5 = probe_seq<16UL>::index((probe_seq<16UL> *)&ctrl,(char *)b,__c);
    pcVar6 = (char *)capacity(this);
  } while (pcVar5 <= pcVar6);
  __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe37,
                "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, double>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, double>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<int, double>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, double>>, K = int]"
               );
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }